

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O1

mk_list * mk_string_split_line(char *line)

{
  mk_list *pmVar1;
  int iVar2;
  mk_list *pmVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 *puVar6;
  uint pos_end;
  uint pos_init;
  ulong uVar7;
  int len;
  uint uVar8;
  
  if (line != (char *)0x0) {
    pmVar3 = (mk_list *)malloc(0x10);
    if (pmVar3 == (mk_list *)0x0) {
LAB_001127c3:
      perror("malloc");
    }
    if (pmVar3 != (mk_list *)0x0) {
      pmVar3->next = pmVar3;
      pmVar3->prev = pmVar3;
      sVar4 = strlen(line);
      uVar8 = (uint)sVar4;
      if (uVar8 == 0) {
        return pmVar3;
      }
      uVar7 = 0;
      do {
        pos_init = (uint)uVar7;
        len = uVar8 - pos_init;
        iVar2 = mk_string_char_search(line + uVar7,0x20,len);
        pos_end = uVar8;
        if (((iVar2 < 0) || (uVar8 <= iVar2 + pos_init)) ||
           (len = iVar2, pos_end = iVar2 + pos_init, iVar2 != 0)) {
          pcVar5 = mk_string_copy_substr(line,pos_init,pos_end);
          puVar6 = (undefined8 *)malloc(0x20);
          if (puVar6 == (undefined8 *)0x0) {
            mk_string_split_line_cold_1();
            goto LAB_001127c3;
          }
          *puVar6 = pcVar5;
          *(int *)(puVar6 + 1) = len;
          pmVar1 = pmVar3->prev;
          pmVar3->prev = (mk_list *)(puVar6 + 2);
          puVar6[3] = pmVar3;
          puVar6[2] = pmVar1;
          pmVar1->next = (mk_list *)(puVar6 + 2);
          pos_init = pos_end;
        }
        uVar7 = (ulong)(pos_init + 1);
        if (uVar8 <= pos_init + 1) {
          return pmVar3;
        }
      } while( true );
    }
  }
  return (mk_list *)0x0;
}

Assistant:

struct mk_list *mk_string_split_line(const char *line)
{
    unsigned int i = 0, len, val_len;
    int end;
    char *val;
    struct mk_list *list;
    struct mk_string_line *new;

    if (!line) {
        return NULL;
    }

    list = mk_mem_alloc(sizeof(struct mk_list));
    if (!list) {
        return NULL;
    }
    mk_list_init(list);

    len = strlen(line);

    while (i < len) {
        end = mk_string_char_search(line + i, ' ', len - i);

        if (end >= 0 && end + i < len) {
            end += i;

            if (i == (unsigned int) end) {
                i++;
                continue;
            }

            val = mk_string_copy_substr(line, i, end);
            val_len = end - i;
        }
        else {
            val = mk_string_copy_substr(line, i, len);
            val_len = len - i;
            end = len;

        }

        /* Alloc node */
        new = mk_mem_alloc(sizeof(struct mk_string_line));
        new->val = val;
        new->len = val_len;

        mk_list_add(&new->_head, list);
        i = end + 1;
    }

    return list;
}